

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece.pb.h
# Opt level: O2

void __thiscall
sentencepiece::SentencePieceText::set_text(SentencePieceText *this,char *value,size_t size)

{
  void *pvVar1;
  undefined1 *local_30 [2];
  undefined1 local_20 [16];
  
  *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
  local_30[0] = local_20;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_30,value,value + size);
  pvVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    pvVar1 = *(void **)((ulong)pvVar1 & 0xfffffffffffffffe);
  }
  google::protobuf::internal::ArenaStringPtr::Set(&this->text_,local_30,pvVar1);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

inline void SentencePieceText::set_text(const char* value,
    size_t size) {
  _has_bits_[0] |= 0x00000001u;
  text_.Set(::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::EmptyDefault{}, ::std::string(
      reinterpret_cast<const char*>(value), size), GetArena());
  // @@protoc_insertion_point(field_set_pointer:sentencepiece.SentencePieceText.text)
}